

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QFontDatabasePrivate::ExtendedScript,QList<QString>>::emplace<QList<QString>const&>
          (QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *this,ExtendedScript *key,
          QList<QString> *args)

{
  long lVar1;
  bool bVar2;
  ExtendedScript *in_RSI;
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *in_RDI;
  long in_FS_OFFSET;
  QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> copy;
  QList<QString> *in_stack_ffffffffffffff88;
  QList<QString> *in_stack_ffffffffffffff90;
  QList<QString> *in_stack_ffffffffffffff98;
  ExtendedScript *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::isDetached
                    ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)
                     in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
            shouldGrow(in_RDI->d);
    if (bVar2) {
      QList<QString>::QList(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)emplace_helper<QList<QString>>(in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QList<QString>::~QList((QList<QString> *)0x757f7e);
    }
    else {
      local_38 = (piter)emplace_helper<QList<QString>const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::QHash
              ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)
               in_stack_ffffffffffffff90,
               (QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)
               in_stack_ffffffffffffff88);
    QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::detach
              ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)
               in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QList<QString>const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::~QHash
              ((QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *)
               in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }